

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_genericmodel.cpp
# Opt level: O2

void __thiscall tst_GenericModel::removeRow(tst_GenericModel *this)

{
  uint uVar1;
  long lVar2;
  char cVar3;
  byte bVar4;
  bool bVar5;
  int iVar6;
  uint *puVar7;
  long lVar8;
  value_type args;
  GenericModel testModel;
  QSignalSpy *spyArr [2];
  QModelIndex local_170;
  ModelTest probe;
  QModelIndex local_148;
  QSignalSpy rowsAboutToBeRemovedSpy;
  QSignalSpy rowsRemovedSpy;
  
  puVar7 = (uint *)QTest::qData("insertCol",2);
  uVar1 = *puVar7;
  GenericModel::GenericModel(&testModel,(QObject *)0x0);
  ModelTest::ModelTest(&probe,(QAbstractItemModel *)&testModel,(QObject *)0x0);
  if (0 < (int)uVar1) {
    rowsAboutToBeRemovedSpy.super_QObject = (QObject)0xff;
    rowsAboutToBeRemovedSpy._1_7_ = 0xffffffffffffff;
    rowsAboutToBeRemovedSpy._8_8_ = 0;
    rowsAboutToBeRemovedSpy.super_QList<QList<QVariant>_>.d.d = (Data *)0x0;
    GenericModel::insertColumns((int)&testModel,0,(QModelIndex *)(ulong)uVar1);
  }
  rowsAboutToBeRemovedSpy.super_QObject = (QObject)0xff;
  rowsAboutToBeRemovedSpy._1_7_ = 0xffffffffffffff;
  rowsAboutToBeRemovedSpy._8_8_ = 0;
  rowsAboutToBeRemovedSpy.super_QList<QList<QVariant>_>.d.d = (Data *)0x0;
  GenericModel::insertRows((int)&testModel,0,(QModelIndex *)0xd);
  QSignalSpy::QSignalSpy
            (&rowsAboutToBeRemovedSpy,(QObject *)&testModel,
             "2rowsAboutToBeRemoved(QModelIndex, int, int)");
  cVar3 = QTest::qVerify(rowsAboutToBeRemovedSpy.sig.d.size != 0,"rowsAboutToBeRemovedSpy.isValid()"
                         ,"",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                         ,0x1dc);
  if (cVar3 == '\0') goto LAB_0010d30c;
  QSignalSpy::QSignalSpy
            (&rowsRemovedSpy,(QObject *)&testModel,"2rowsRemoved(QModelIndex, int, int)");
  cVar3 = QTest::qVerify(rowsRemovedSpy.sig.d.size != 0,"rowsRemovedSpy.isValid()","",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                         ,0x1de);
  if (cVar3 != '\0') {
    args.d.d = (Data *)0xffffffffffffffff;
    args.d.ptr = (QVariant *)0x0;
    args.d.size = 0;
    spyArr[0] = &rowsAboutToBeRemovedSpy;
    spyArr[1] = &rowsRemovedSpy;
    iVar6 = GenericModel::rowCount((QModelIndex *)&testModel);
    cVar3 = QTest::qCompare(iVar6,0xd,"testModel.rowCount()","13",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x1e1);
    if (cVar3 != '\0') {
      args.d.d = (Data *)0xffffffffffffffff;
      args.d.ptr = (QVariant *)0x0;
      args.d.size = 0;
      bVar4 = (**(code **)(_testModel + 0x108))(&testModel,0xffffffffffffffff,1);
      cVar3 = QTest::qVerify((bool)(bVar4 ^ 1),"!testModel.removeRow(-1)","",
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                             ,0x1e2);
      if (cVar3 != '\0') {
        args.d.d = (Data *)0xffffffffffffffff;
        args.d.ptr = (QVariant *)0x0;
        args.d.size = 0;
        iVar6 = GenericModel::rowCount((QModelIndex *)&testModel);
        cVar3 = QTest::qCompare(iVar6,0xd,"testModel.rowCount()","13",
                                "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                ,0x1e3);
        if (cVar3 != '\0') {
          lVar8 = 0;
          do {
            if (lVar8 == 0x10) {
              args.d.d = (Data *)0xffffffffffffffff;
              args.d.ptr = (QVariant *)0x0;
              args.d.size = 0;
              bVar4 = (**(code **)(_testModel + 0x108))(&testModel,0xd,1);
              cVar3 = QTest::qVerify((bool)(bVar4 ^ 1),"!testModel.removeRow(13)","",
                                     "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                     ,0x1e6);
              if (cVar3 != '\0') {
                args.d.d = (Data *)0xffffffffffffffff;
                args.d.ptr = (QVariant *)0x0;
                args.d.size = 0;
                iVar6 = GenericModel::rowCount((QModelIndex *)&testModel);
                cVar3 = QTest::qCompare(iVar6,0xd,"testModel.rowCount()","13",
                                        "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                        ,0x1e7);
                if (cVar3 != '\0') {
                  lVar8 = 0;
                  goto LAB_0010cbe4;
                }
              }
              break;
            }
            cVar3 = QTest::qCompare(*(longlong *)(*(long *)((long)spyArr + lVar8) + 0x20),0,
                                    "spy->count()","0",
                                    "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                    ,0x1e5);
            lVar8 = lVar8 + 8;
          } while (cVar3 != '\0');
        }
      }
    }
  }
  goto LAB_0010d2ff;
  while( true ) {
    cVar3 = QTest::qCompare(*(longlong *)(*(long *)((long)spyArr + lVar8) + 0x20),0,"spy->count()",
                            "0",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x1e9);
    lVar8 = lVar8 + 8;
    if (cVar3 == '\0') break;
LAB_0010cbe4:
    if (lVar8 == 0x10) {
      args.d.d = (Data *)0xffffffffffffffff;
      args.d.ptr = (QVariant *)0x0;
      args.d.size = 0;
      bVar5 = (bool)(**(code **)(_testModel + 0x108))(&testModel,0,1);
      cVar3 = QTest::qVerify(bVar5,"testModel.removeRow(0)","",
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                             ,0x1ea);
      if (cVar3 != '\0') {
        args.d.d = (Data *)0xffffffffffffffff;
        args.d.ptr = (QVariant *)0x0;
        args.d.size = 0;
        iVar6 = GenericModel::rowCount((QModelIndex *)&testModel);
        cVar3 = QTest::qCompare(iVar6,0xc,"testModel.rowCount()","12",
                                "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                ,0x1eb);
        if (cVar3 != '\0') {
          lVar8 = 0;
          goto LAB_0010ccc0;
        }
      }
      break;
    }
  }
  goto LAB_0010d2ff;
  while( true ) {
    lVar2 = *(long *)((long)spyArr + lVar8);
    cVar3 = QTest::qCompare(*(longlong *)(lVar2 + 0x20),1,"spy->count()","1",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x1ed);
    if (cVar3 == '\0') break;
    QList<QList<QVariant>_>::takeFirst(&args,(QList<QList<QVariant>_> *)(lVar2 + 0x10));
    iVar6 = QVariant::toInt((bool *)(args.d.ptr + 2));
    cVar3 = QTest::qCompare(iVar6,0,"args.at(2).toInt()","0",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x1ef);
    if (cVar3 == '\0') goto LAB_0010d2f7;
    iVar6 = QVariant::toInt((bool *)(args.d.ptr + 1));
    cVar3 = QTest::qCompare(iVar6,0,"args.at(1).toInt()","0",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x1f0);
    if (cVar3 == '\0') goto LAB_0010d2f7;
    qvariant_cast<QModelIndex>(&local_148,args.d.ptr);
    local_170.r = -1;
    local_170.c = -1;
    local_170.i = 0;
    local_170.m = (QAbstractItemModel *)0x0;
    bVar5 = QTest::qCompare<QModelIndex,QModelIndex>
                      (&local_148,&local_170,"args.at(0).value<QModelIndex>()","QModelIndex()",
                       "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                       ,0x1f1);
    QArrayDataPointer<QVariant>::~QArrayDataPointer(&args.d);
    lVar8 = lVar8 + 8;
    if (!bVar5) break;
LAB_0010ccc0:
    if (lVar8 == 0x10) {
      args.d.d = (Data *)0xffffffffffffffff;
      args.d.ptr = (QVariant *)0x0;
      args.d.size = 0;
      bVar5 = (bool)(**(code **)(_testModel + 0x108))(&testModel,0,1);
      cVar3 = QTest::qVerify(bVar5,"testModel.removeRow(0)","",
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                             ,499);
      if (cVar3 != '\0') {
        args.d.d = (Data *)0xffffffffffffffff;
        args.d.ptr = (QVariant *)0x0;
        args.d.size = 0;
        iVar6 = GenericModel::rowCount((QModelIndex *)&testModel);
        cVar3 = QTest::qCompare(iVar6,0xb,"testModel.rowCount()","11",
                                "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                ,500);
        if (cVar3 != '\0') {
          lVar8 = 0;
          goto LAB_0010ce79;
        }
      }
      break;
    }
  }
  goto LAB_0010d2ff;
  while( true ) {
    lVar2 = *(long *)((long)spyArr + lVar8);
    cVar3 = QTest::qCompare(*(longlong *)(lVar2 + 0x20),1,"spy->count()","1",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x1f6);
    if (cVar3 == '\0') break;
    QList<QList<QVariant>_>::takeFirst(&args,(QList<QList<QVariant>_> *)(lVar2 + 0x10));
    iVar6 = QVariant::toInt((bool *)(args.d.ptr + 2));
    cVar3 = QTest::qCompare(iVar6,0,"args.at(2).toInt()","0",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x1f8);
    if (cVar3 == '\0') goto LAB_0010d2f7;
    iVar6 = QVariant::toInt((bool *)(args.d.ptr + 1));
    cVar3 = QTest::qCompare(iVar6,0,"args.at(1).toInt()","0",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x1f9);
    if (cVar3 == '\0') goto LAB_0010d2f7;
    qvariant_cast<QModelIndex>(&local_148,args.d.ptr);
    local_170.r = -1;
    local_170.c = -1;
    local_170.i = 0;
    local_170.m = (QAbstractItemModel *)0x0;
    bVar5 = QTest::qCompare<QModelIndex,QModelIndex>
                      (&local_148,&local_170,"args.at(0).value<QModelIndex>()","QModelIndex()",
                       "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                       ,0x1fa);
    QArrayDataPointer<QVariant>::~QArrayDataPointer(&args.d);
    lVar8 = lVar8 + 8;
    if (!bVar5) break;
LAB_0010ce79:
    if (lVar8 == 0x10) {
      args.d.d = (Data *)0xffffffffffffffff;
      args.d.ptr = (QVariant *)0x0;
      args.d.size = 0;
      bVar5 = (bool)(**(code **)(_testModel + 0x108))(&testModel,1);
      cVar3 = QTest::qVerify(bVar5,"testModel.removeRow(1)","",
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                             ,0x1fc);
      if (cVar3 != '\0') {
        args.d.d = (Data *)0xffffffffffffffff;
        args.d.ptr = (QVariant *)0x0;
        args.d.size = 0;
        iVar6 = GenericModel::rowCount((QModelIndex *)&testModel);
        cVar3 = QTest::qCompare(iVar6,10,"testModel.rowCount()","10",
                                "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                ,0x1fd);
        if (cVar3 != '\0') {
          lVar8 = 0;
          goto LAB_0010d032;
        }
      }
      break;
    }
  }
  goto LAB_0010d2ff;
  while( true ) {
    lVar2 = *(long *)((long)spyArr + lVar8);
    cVar3 = QTest::qCompare(*(longlong *)(lVar2 + 0x20),1,"spy->count()","1",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x1ff);
    if (cVar3 == '\0') break;
    QList<QList<QVariant>_>::takeFirst(&args,(QList<QList<QVariant>_> *)(lVar2 + 0x10));
    iVar6 = QVariant::toInt((bool *)(args.d.ptr + 2));
    cVar3 = QTest::qCompare(iVar6,1,"args.at(2).toInt()","1",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x201);
    if (cVar3 == '\0') goto LAB_0010d2f7;
    iVar6 = QVariant::toInt((bool *)(args.d.ptr + 1));
    cVar3 = QTest::qCompare(iVar6,1,"args.at(1).toInt()","1",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x202);
    if (cVar3 == '\0') goto LAB_0010d2f7;
    qvariant_cast<QModelIndex>(&local_148,args.d.ptr);
    local_170.r = -1;
    local_170.c = -1;
    local_170.i = 0;
    local_170.m = (QAbstractItemModel *)0x0;
    bVar5 = QTest::qCompare<QModelIndex,QModelIndex>
                      (&local_148,&local_170,"args.at(0).value<QModelIndex>()","QModelIndex()",
                       "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                       ,0x203);
    QArrayDataPointer<QVariant>::~QArrayDataPointer(&args.d);
    lVar8 = lVar8 + 8;
    if (!bVar5) break;
LAB_0010d032:
    if (lVar8 == 0x10) {
      args.d.d = (Data *)0xffffffffffffffff;
      args.d.ptr = (QVariant *)0x0;
      args.d.size = 0;
      bVar5 = (bool)(**(code **)(_testModel + 0x108))(&testModel,9,1);
      cVar3 = QTest::qVerify(bVar5,"testModel.removeRow(9)","",
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                             ,0x205);
      if (cVar3 != '\0') {
        args.d.d = (Data *)0xffffffffffffffff;
        args.d.ptr = (QVariant *)0x0;
        args.d.size = 0;
        iVar6 = GenericModel::rowCount((QModelIndex *)&testModel);
        cVar3 = QTest::qCompare(iVar6,9,"testModel.rowCount()","9",
                                "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                ,0x206);
        if (cVar3 != '\0') {
          lVar8 = 0;
          goto LAB_0010d1eb;
        }
      }
      break;
    }
  }
  goto LAB_0010d2ff;
LAB_0010d2f7:
  QArrayDataPointer<QVariant>::~QArrayDataPointer(&args.d);
  goto LAB_0010d2ff;
  while( true ) {
    lVar2 = *(long *)((long)spyArr + lVar8);
    cVar3 = QTest::qCompare(*(longlong *)(lVar2 + 0x20),1,"spy->count()","1",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x208);
    if (cVar3 == '\0') break;
    QList<QList<QVariant>_>::takeFirst(&args,(QList<QList<QVariant>_> *)(lVar2 + 0x10));
    iVar6 = QVariant::toInt((bool *)(args.d.ptr + 2));
    cVar3 = QTest::qCompare(iVar6,9,"args.at(2).toInt()","9",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x20a);
    if (cVar3 == '\0') goto LAB_0010d2f7;
    iVar6 = QVariant::toInt((bool *)(args.d.ptr + 1));
    cVar3 = QTest::qCompare(iVar6,9,"args.at(1).toInt()","9",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x20b);
    if (cVar3 == '\0') goto LAB_0010d2f7;
    qvariant_cast<QModelIndex>(&local_148,args.d.ptr);
    local_170.r = -1;
    local_170.c = -1;
    local_170.i = 0;
    local_170.m = (QAbstractItemModel *)0x0;
    bVar5 = QTest::qCompare<QModelIndex,QModelIndex>
                      (&local_148,&local_170,"args.at(0).value<QModelIndex>()","QModelIndex()",
                       "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                       ,0x20c);
    QArrayDataPointer<QVariant>::~QArrayDataPointer(&args.d);
    lVar8 = lVar8 + 8;
    if (!bVar5) break;
LAB_0010d1eb:
    if (lVar8 == 0x10) break;
  }
LAB_0010d2ff:
  QSignalSpy::~QSignalSpy(&rowsRemovedSpy);
LAB_0010d30c:
  QSignalSpy::~QSignalSpy(&rowsAboutToBeRemovedSpy);
  QObject::~QObject((QObject *)&probe);
  GenericModel::~GenericModel(&testModel);
  return;
}

Assistant:

void tst_GenericModel::removeRow()
{
    QFETCH(int, insertCol);
    GenericModel testModel;
    ModelTest probe(&testModel, nullptr);
    if (insertCol > 0)
        testModel.insertColumns(0, insertCol);
    testModel.insertRows(0, 13);
    QSignalSpy rowsAboutToBeRemovedSpy(&testModel, SIGNAL(rowsAboutToBeRemoved(QModelIndex, int, int)));
    QVERIFY(rowsAboutToBeRemovedSpy.isValid());
    QSignalSpy rowsRemovedSpy(&testModel, SIGNAL(rowsRemoved(QModelIndex, int, int)));
    QVERIFY(rowsRemovedSpy.isValid());
    QSignalSpy *const spyArr[] = {&rowsAboutToBeRemovedSpy, &rowsRemovedSpy};

    QCOMPARE(testModel.rowCount(), 13);
    QVERIFY(!testModel.removeRow(-1));
    QCOMPARE(testModel.rowCount(), 13);
    for (QSignalSpy *spy : spyArr)
        QCOMPARE(spy->count(), 0);
    QVERIFY(!testModel.removeRow(13));
    QCOMPARE(testModel.rowCount(), 13);
    for (QSignalSpy *spy : spyArr)
        QCOMPARE(spy->count(), 0);
    QVERIFY(testModel.removeRow(0));
    QCOMPARE(testModel.rowCount(), 12);
    for (QSignalSpy *spy : spyArr) {
        QCOMPARE(spy->count(), 1);
        const auto args = spy->takeFirst();
        QCOMPARE(args.at(2).toInt(), 0);
        QCOMPARE(args.at(1).toInt(), 0);
        QCOMPARE(args.at(0).value<QModelIndex>(), QModelIndex());
    }
    QVERIFY(testModel.removeRow(0));
    QCOMPARE(testModel.rowCount(), 11);
    for (QSignalSpy *spy : spyArr) {
        QCOMPARE(spy->count(), 1);
        const auto args = spy->takeFirst();
        QCOMPARE(args.at(2).toInt(), 0);
        QCOMPARE(args.at(1).toInt(), 0);
        QCOMPARE(args.at(0).value<QModelIndex>(), QModelIndex());
    }
    QVERIFY(testModel.removeRow(1));
    QCOMPARE(testModel.rowCount(), 10);
    for (QSignalSpy *spy : spyArr) {
        QCOMPARE(spy->count(), 1);
        const auto args = spy->takeFirst();
        QCOMPARE(args.at(2).toInt(), 1);
        QCOMPARE(args.at(1).toInt(), 1);
        QCOMPARE(args.at(0).value<QModelIndex>(), QModelIndex());
    }
    QVERIFY(testModel.removeRow(9));
    QCOMPARE(testModel.rowCount(), 9);
    for (QSignalSpy *spy : spyArr) {
        QCOMPARE(spy->count(), 1);
        const auto args = spy->takeFirst();
        QCOMPARE(args.at(2).toInt(), 9);
        QCOMPARE(args.at(1).toInt(), 9);
        QCOMPARE(args.at(0).value<QModelIndex>(), QModelIndex());
    }
}